

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

char * nni_http_get_reason(nng_http *conn)

{
  char *pcVar1;
  
  if (conn->rsn != (char *)0x0) {
    return conn->rsn;
  }
  pcVar1 = nni_http_reason(conn->code);
  return pcVar1;
}

Assistant:

const char *
nni_http_get_reason(nng_http *conn)
{
	return (conn->rsn ? conn->rsn : nni_http_reason(conn->code));
}